

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateConstructorCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_81;
  LogMessage local_80;
  Formatter format;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  if (this->inlined_ == true) {
    if (*(long *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x40) + 8) == 0)
    goto LAB_0030ce51;
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_string_field.cc"
               ,0x1b8);
    other = internal::LogMessage::operator<<(&local_80,"CHECK failed: !inlined_: ");
    internal::LogFinisher::operator=(&local_81,other);
    internal::LogMessage::~LogMessage(&local_80);
  }
  Formatter::operator()<>(&format,"$name$_.UnsafeSetDefault($init_value$);\n");
  bVar1 = IsString((this->super_FieldGenerator).descriptor_,(this->super_FieldGenerator).options_);
  if ((bVar1) && (*(long *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x40) + 8) == 0)) {
    Formatter::operator()<>
              (&format,
               "#ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING\n  $name$_.Set($init_value$, \"\", GetArenaForAllocation());\n#endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING\n"
              );
  }
LAB_0030ce51:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void StringFieldGenerator::GenerateConstructorCode(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (inlined_ && descriptor_->default_value_string().empty()) {
    // Automatic initialization will construct the string.
    return;
  }
  GOOGLE_DCHECK(!inlined_);
  format("$name$_.UnsafeSetDefault($init_value$);\n");
  if (IsString(descriptor_, options_) &&
      descriptor_->default_value_string().empty()) {
    format(
        "#ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING\n"
        "  $name$_.Set($init_value$, \"\", GetArenaForAllocation());\n"
        "#endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING\n");
  }
}